

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectivePosition(Parser *parser,int flags)

{
  bool bVar1;
  undefined2 in_DX;
  undefined4 in_register_00000034;
  undefined1 local_58 [20];
  Type type;
  undefined1 local_38 [8];
  Expression exp;
  int flags_local;
  Parser *parser_local;
  
  exp._20_2_ = in_DX;
  Parser::parseExpression((Expression *)local_38,(Parser *)CONCAT44(in_register_00000034,flags));
  bVar1 = Expression::isLoaded((Expression *)local_38);
  if (bVar1) {
    if (exp._20_2_ == 1) {
      local_58._12_4_ = 0;
    }
    else {
      if (exp._20_2_ != 2) {
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<std::default_delete<CAssemblerCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (nullptr_t)0x0);
        goto LAB_00204fcc;
      }
      local_58._12_4_ = 1;
    }
    std::make_unique<CDirectivePosition,Expression&,CDirectivePosition::Type&>
              ((Expression *)local_58,(Type *)local_38);
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<CDirectivePosition,std::default_delete<CDirectivePosition>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (unique_ptr<CDirectivePosition,_std::default_delete<CDirectivePosition>_> *)local_58)
    ;
    std::unique_ptr<CDirectivePosition,_std::default_delete<CDirectivePosition>_>::~unique_ptr
              ((unique_ptr<CDirectivePosition,_std::default_delete<CDirectivePosition>_> *)local_58)
    ;
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
LAB_00204fcc:
  local_58._16_4_ = 1;
  Expression::~Expression((Expression *)local_38);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectivePosition(Parser& parser, int flags)
{
	Expression exp = parser.parseExpression();
	if (!exp.isLoaded())
		return nullptr;

	CDirectivePosition::Type type;
	switch (flags & DIRECTIVE_USERMASK)
	{
	case DIRECTIVE_POS_PHYSICAL:
		type = CDirectivePosition::Physical;
		break;
	case DIRECTIVE_POS_VIRTUAL:
		type = CDirectivePosition::Virtual;
		break;
	default:
		return nullptr;
	}

	return std::make_unique<CDirectivePosition>(exp,type);
}